

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.hpp
# Opt level: O3

void __thiscall
TI::TMS::Base<(TI::TMS::Personality)3>::draw_sms
          (Base<(TI::TMS::Personality)3> *this,int start,int end,uint32_t cram_dot)

{
  uint32_t uVar1;
  iterator pvVar2;
  uint32_t *puVar3;
  long lVar4;
  sbyte sVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  byte bVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int colour_buffer [256];
  uint local_438 [258];
  
  pvVar2 = this->draw_line_buffer_;
  lVar19 = (long)start;
  uVar9 = start;
  if ((0xf < (this->output_pointer_).row) ||
     (uVar12 = start, iVar11 = end,
     (this->super_Storage<(TI::TMS::Personality)3,_void>).horizontal_scroll_lock_ == false)) {
    uVar6 = pvVar2->latched_horizontal_scroll & 7;
    uVar12 = start - uVar6;
    if (start < (int)uVar6) {
      uVar16 = this->background_colour_ + 0x10;
      lVar4 = ((ulong)uVar6 - lVar19) + -1;
      auVar20._8_4_ = (int)lVar4;
      auVar20._0_8_ = lVar4;
      auVar20._12_4_ = (int)((ulong)lVar4 >> 0x20);
      uVar14 = 0;
      auVar20 = auVar20 ^ _DAT_00463a50;
      do {
        auVar21._8_4_ = (int)uVar14;
        auVar21._0_8_ = uVar14;
        auVar21._12_4_ = (int)(uVar14 >> 0x20);
        auVar22 = (auVar21 | _DAT_00463a40) ^ _DAT_00463a50;
        iVar11 = auVar20._4_4_;
        if ((bool)(~(auVar22._4_4_ == iVar11 && auVar20._0_4_ < auVar22._0_4_ ||
                    iVar11 < auVar22._4_4_) & 1)) {
          local_438[lVar19 + uVar14] = uVar16;
        }
        if ((auVar22._12_4_ != auVar20._12_4_ || auVar22._8_4_ <= auVar20._8_4_) &&
            auVar22._12_4_ <= auVar20._12_4_) {
          local_438[lVar19 + uVar14 + 1] = uVar16;
        }
        auVar21 = (auVar21 | _DAT_00463a30) ^ _DAT_00463a50;
        iVar10 = auVar21._4_4_;
        if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar21._0_4_ <= auVar20._0_4_)) {
          local_438[lVar19 + uVar14 + 2] = uVar16;
          local_438[lVar19 + uVar14 + 3] = uVar16;
        }
        uVar14 = uVar14 + 4;
        uVar9 = uVar6;
      } while ((((ulong)uVar6 - lVar19) + 3 & 0xfffffffffffffffc) != uVar14);
    }
    if ((int)uVar12 < 1) {
      uVar12 = 0;
    }
    iVar11 = end - uVar6;
    if (iVar11 < 1) {
      iVar11 = 0;
    }
  }
  if ((int)uVar12 < end) {
    iVar11 = iVar11 - uVar12;
    iVar10 = 8 - (uVar12 & 7);
    if (iVar11 <= iVar10) {
      iVar10 = iVar11;
    }
    lVar4 = (long)((int)uVar12 >> 3);
    uVar6 = *(uint *)((long)&pvVar2->field_5 + lVar4 * 4 + 0x20);
    bVar13 = (pvVar2->field_5).bitmap[lVar4];
    sVar5 = (sbyte)(uVar12 & 7);
    uVar12 = uVar6 << sVar5;
    if ((bVar13 & 2) != 0) {
      uVar12 = uVar6 >> sVar5;
    }
    do {
      uVar14 = (ulong)(uVar12 >> 8);
      uVar15 = (ulong)(uVar12 >> 0x10);
      uVar18 = (ulong)(uVar12 >> 0x18);
      uVar6 = (uint)bVar13 + (uint)bVar13 & 0x30;
      if ((bVar13 & 2) == 0) {
        if (0 < iVar10) {
          lVar8 = 0;
          do {
            local_438[(int)uVar9 + lVar8] =
                 (uVar12 & 0xff) >> 7 |
                 (uint)(uVar14 >> 6) & 2 | (uint)(uVar15 >> 5) & 4 | (uint)(uVar18 >> 4) & 8 | uVar6
            ;
            uVar12 = (((uint)uVar14 & 0xff) << 8 |
                      ((uint)uVar15 & 0xff) << 0x10 | (int)uVar18 << 0x18 | uVar12 & 0xff) * 2;
            uVar14 = (ulong)(uVar12 >> 8);
            uVar15 = (ulong)(uVar12 >> 0x10);
            uVar18 = (ulong)(uVar12 >> 0x18);
            lVar8 = lVar8 + 1;
            iVar7 = (int)lVar8;
          } while (iVar10 != iVar7);
LAB_0018a186:
          uVar9 = uVar9 + iVar7;
        }
      }
      else if (0 < iVar10) {
        lVar8 = 0;
        do {
          local_438[(int)uVar9 + lVar8] =
               ((uint)uVar18 & 1) * 8 + ((uint)uVar15 & 1) * 4 + ((uint)uVar14 & 1) * 2 | uVar12 & 1
               | uVar6;
          uVar16 = ((uint)uVar15 & 0xff) << 0x10 | (uint)uVar18 << 0x18;
          uVar17 = ((uint)uVar14 & 0xff) << 8 | uVar16;
          uVar12 = (uVar12 & 0xfe | uVar17) >> 1;
          uVar14 = (ulong)(uVar17 >> 9);
          uVar15 = (ulong)(uVar16 >> 0x11);
          uVar18 = uVar18 >> 1;
          lVar8 = lVar8 + 1;
          iVar7 = (int)lVar8;
        } while (iVar10 != iVar7);
        goto LAB_0018a186;
      }
      iVar11 = iVar11 - iVar10;
      if (iVar11 == 0) break;
      iVar10 = 8;
      if (iVar11 < 8) {
        iVar10 = iVar11;
      }
      lVar8 = lVar4 * 4;
      bVar13 = (pvVar2->field_5).bitmap[lVar4 + 1];
      lVar4 = lVar4 + 1;
      uVar12 = *(uint *)((long)&pvVar2->field_5 + lVar8 + 0x24);
    } while( true );
  }
  draw_sprites<(TI::TMS::SpriteMode)2,false>(this,'\0',start,end,&default_palette,(int *)local_438);
  puVar3 = this->pixel_target_;
  puVar3[lVar19] =
       cram_dot |
       (this->super_Storage<(TI::TMS::Personality)3,_void>).colour_ram_[local_438[lVar19] & 0x1f];
  iVar11 = start + 1;
  if (iVar11 < end) {
    lVar19 = 0;
    do {
      puVar3[iVar11 + lVar19] =
           (this->super_Storage<(TI::TMS::Personality)3,_void>).colour_ram_
           [local_438[iVar11 + lVar19] & 0x1f];
      lVar19 = lVar19 + 1;
    } while (~start + end != (int)lVar19);
  }
  if ((end == 0x100) &&
     ((this->super_Storage<(TI::TMS::Personality)3,_void>).hide_left_column_ == true)) {
    puVar3 = this->pixel_origin_;
    uVar1 = (this->super_Storage<(TI::TMS::Personality)3,_void>).colour_ram_
            [(ulong)this->background_colour_ + 0x10];
    puVar3[4] = uVar1;
    puVar3[5] = uVar1;
    puVar3[6] = uVar1;
    puVar3[7] = uVar1;
    *puVar3 = uVar1;
    puVar3[1] = uVar1;
    puVar3[2] = uVar1;
    puVar3[3] = uVar1;
  }
  return;
}

Assistant:

void Base<personality>::draw_sms([[maybe_unused]] int start, [[maybe_unused]] int end, [[maybe_unused]] uint32_t cram_dot) {
	if constexpr (is_sega_vdp(personality)) {
		int colour_buffer[256];
		auto &line_buffer = *draw_line_buffer_;

		/*
			Add extra border for any pixels that fall before the fine scroll.
		*/
		int tile_start = start, tile_end = end;
		int tile_offset = start;
		if(output_pointer_.row >= 16 || !Storage<personality>::horizontal_scroll_lock_) {
			for(int c = start; c < (line_buffer.latched_horizontal_scroll & 7); ++c) {
				colour_buffer[c] = 16 + background_colour_;
				++tile_offset;
			}

			// Remove the border area from that to which tiles will be drawn.
			tile_start = std::max(start - (line_buffer.latched_horizontal_scroll & 7), 0);
			tile_end = std::max(end - (line_buffer.latched_horizontal_scroll & 7), 0);
		}


		uint32_t pattern;
		uint8_t *const pattern_index = reinterpret_cast<uint8_t *>(&pattern);

		/*
			Add background tiles; these will fill the colour_buffer with values in which
			the low five bits are a palette index, and bit six is set if this tile has
			priority over sprites.
		*/
		if(tile_start < end) {
			const int shift = tile_start & 7;
			int byte_column = tile_start >> 3;
			int pixels_left = tile_end - tile_start;
			int length = std::min(pixels_left, 8 - shift);

			pattern = *reinterpret_cast<const uint32_t *>(line_buffer.tiles.patterns[byte_column]);
			if(line_buffer.tiles.flags[byte_column]&2)
				pattern >>= shift;
			else
				pattern <<= shift;

			while(true) {
				const int palette_offset = (line_buffer.tiles.flags[byte_column]&0x18) << 1;
				if(line_buffer.tiles.flags[byte_column]&2) {
					for(int c = 0; c < length; ++c) {
						colour_buffer[tile_offset] =
							((pattern_index[3] & 0x01) << 3) |
							((pattern_index[2] & 0x01) << 2) |
							((pattern_index[1] & 0x01) << 1) |
							((pattern_index[0] & 0x01) << 0) |
							palette_offset;
						++tile_offset;
						pattern >>= 1;
					}
				} else {
					for(int c = 0; c < length; ++c) {
						colour_buffer[tile_offset] =
							((pattern_index[3] & 0x80) >> 4) |
							((pattern_index[2] & 0x80) >> 5) |
							((pattern_index[1] & 0x80) >> 6) |
							((pattern_index[0] & 0x80) >> 7) |
							palette_offset;
						++tile_offset;
						pattern <<= 1;
					}
				}

				pixels_left -= length;
				if(!pixels_left) break;

				length = std::min(8, pixels_left);
				byte_column++;
				pattern = *reinterpret_cast<const uint32_t *>(line_buffer.tiles.patterns[byte_column]);
			}
		}

		/*
			Apply sprites (if any).
		*/
		draw_sprites<SpriteMode::MasterSystem, false>(0, start, end, palette(), colour_buffer);	// TODO provide good y, as per elsewhere.

		// Map from the 32-colour buffer to real output pixels, applying the specific CRAM dot if any.
		pixel_target_[start] = Storage<personality>::colour_ram_[colour_buffer[start] & 0x1f] | cram_dot;
		for(int c = start+1; c < end; ++c) {
			pixel_target_[c] = Storage<personality>::colour_ram_[colour_buffer[c] & 0x1f];
		}

		// If the VDP is set to hide the left column and this is the final call that'll come
		// this line, hide it.
		if(end == 256) {
			if(Storage<personality>::hide_left_column_) {
				pixel_origin_[0] = pixel_origin_[1] = pixel_origin_[2] = pixel_origin_[3] =
				pixel_origin_[4] = pixel_origin_[5] = pixel_origin_[6] = pixel_origin_[7] =
					Storage<personality>::colour_ram_[16 + background_colour_];
			}
		}
	}
}